

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_complete_unit_list.cpp
# Opt level: O0

void __thiscall
completeUnits_unitTypes_Test::~completeUnits_unitTypes_Test(completeUnits_unitTypes_Test *this)

{
  completeUnits_unitTypes_Test *this_local;
  
  ~completeUnits_unitTypes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(completeUnits, unitTypes)
{
    std::ifstream tfile(TEST_FILE_FOLDER "/complete_unit_list.txt");
    ASSERT_TRUE(tfile.is_open());
    std::string tp;
    int validCount{0};
    int invalidCount{0};

    while (std::getline(tfile, tp)) {
        if (tp.size() < 3 || tp.front() == '#') {
            continue;
        }
        auto cloc = tp.find_first_of(',');
        std::string ostring = tp.substr(0, cloc);
        std::string testUnitString = hexConvert(ostring);

        auto bunit = units::unit_from_string(testUnitString);
        if (is_valid(bunit)) {
            ++validCount;
        } else {
            ++invalidCount;
            std::cout << "could not convert " << testUnitString << "("
                      << ostring << ")\n";
        }
    }
    // this number should go down as more of them are supported
    EXPECT_LE(invalidCount, 1174);
    std::cout << "converted " << validCount << " units successfully\n";
    std::cout << " failed to convert " << invalidCount << " unit strings\n";
}